

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

HighsStatus cleanBounds(HighsOptions *options,HighsLp *lp)

{
  HighsLogOptions *pHVar1;
  uint uVar2;
  value_type vVar3;
  reference pvVar4;
  double *pdVar5;
  int *in_RSI;
  long in_RDI;
  bool bVar6;
  double dVar7;
  double mid_1;
  double residual_1;
  HighsInt iRow;
  double mid;
  double residual;
  HighsInt iCol;
  HighsInt num_change;
  double max_residual;
  char *local_48;
  uint local_3c;
  value_type local_38;
  char *local_30;
  uint local_28;
  uint local_24;
  HighsLogOptions *local_20;
  int *local_18;
  long local_10;
  HighsStatus local_4;
  
  local_20 = (HighsLogOptions *)0x0;
  local_24 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  for (local_28 = 0; (int)local_28 < *local_18; local_28 = local_28 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_18 + 8),
                        (long)(int)local_28);
    dVar7 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_18 + 0xe),
                        (long)(int)local_28);
    uVar2 = local_28;
    local_30 = (char *)(dVar7 - *pvVar4);
    if (*(double *)(local_10 + 0x118) <= (double)local_30 &&
        (double)local_30 != *(double *)(local_10 + 0x118)) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 8),
                          (long)(int)local_28);
      pHVar1 = (HighsLogOptions *)*pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0xe),
                          (long)(int)local_28);
      highsLogUser(pHVar1,(HighsLogType)*pvVar4,local_30,local_10 + 0x380,5,
                   "Column %d has inconsistent bounds [%g, %g] (residual = %g) after presolve\n",
                   (ulong)uVar2);
      return kError;
    }
    if (0.0 < (double)local_30) {
      local_24 = local_24 + 1;
      pdVar5 = std::max<double>((double *)&local_30,(double *)&local_20);
      local_20 = (HighsLogOptions *)*pdVar5;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 8),
                          (long)(int)local_28);
      dVar7 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0xe),
                          (long)(int)local_28);
      dVar7 = (dVar7 + *pvVar4) * 0.5;
      local_38 = dVar7;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 8),
                          (long)(int)local_28);
      vVar3 = local_38;
      *pvVar4 = dVar7;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0xe),
                          (long)(int)local_28);
      *pvVar4 = vVar3;
    }
  }
  local_3c = 0;
  while( true ) {
    if (local_18[1] <= (int)local_3c) {
      bVar6 = local_24 != 0;
      if (bVar6) {
        highsLogUser(local_20,(HighsLogType)(local_10 + 0x380),(char *)0x4,
                     "Resolved %d inconsistent bounds (maximum residual = %9.4g) after presolve\n",
                     (ulong)local_24);
      }
      local_4 = (HighsStatus)bVar6;
      return local_4;
    }
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_18 + 0x14),
                        (long)(int)local_3c);
    dVar7 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_18 + 0x1a),
                        (long)(int)local_3c);
    uVar2 = local_3c;
    local_48 = (char *)(dVar7 - *pvVar4);
    if (*(double *)(local_10 + 0x118) <= (double)local_48 &&
        (double)local_48 != *(double *)(local_10 + 0x118)) break;
    if (0.0 < (double)local_48) {
      local_24 = local_24 + 1;
      pdVar5 = std::max<double>((double *)&local_48,(double *)&local_20);
      local_20 = (HighsLogOptions *)*pdVar5;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0x14),
                          (long)(int)local_3c);
      dVar7 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0x1a),
                          (long)(int)local_3c);
      dVar7 = (dVar7 + *pvVar4) * 0.5;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0x14),
                          (long)(int)local_3c);
      *pvVar4 = dVar7;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0x1a),
                          (long)(int)local_3c);
      *pvVar4 = dVar7;
    }
    local_3c = local_3c + 1;
  }
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(local_18 + 0x14),
                      (long)(int)local_3c);
  pHVar1 = (HighsLogOptions *)*pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(local_18 + 0x1a),
                      (long)(int)local_3c);
  highsLogUser(pHVar1,(HighsLogType)*pvVar4,local_48,local_10 + 0x380,5,
               "Row %d has inconsistent bounds [%g, %g] (residual = %g) after presolve\n",
               (ulong)uVar2);
  return kError;
}

Assistant:

HighsStatus cleanBounds(const HighsOptions& options, HighsLp& lp) {
  double max_residual = 0;
  HighsInt num_change = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    double residual = lp.col_lower_[iCol] - lp.col_upper_[iCol];
    if (residual > options.primal_feasibility_tolerance) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Column %" HIGHSINT_FORMAT
                   " has inconsistent bounds [%g, %g] (residual = "
                   "%g) after presolve\n",
                   iCol, lp.col_lower_[iCol], lp.col_upper_[iCol], residual);
      return HighsStatus::kError;
    } else if (residual > 0) {
      num_change++;
      max_residual = std::max(residual, max_residual);
      double mid = 0.5 * (lp.col_lower_[iCol] + lp.col_upper_[iCol]);
      lp.col_lower_[iCol] = mid;
      lp.col_upper_[iCol] = mid;
    }
  }
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    double residual = lp.row_lower_[iRow] - lp.row_upper_[iRow];
    if (residual > options.primal_feasibility_tolerance) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Row %" HIGHSINT_FORMAT
                   " has inconsistent bounds [%g, %g] (residual = %g) "
                   "after presolve\n",
                   iRow, lp.row_lower_[iRow], lp.row_upper_[iRow], residual);
      return HighsStatus::kError;
    } else if (residual > 0) {
      num_change++;
      max_residual = std::max(residual, max_residual);
      double mid = 0.5 * (lp.row_lower_[iRow] + lp.row_upper_[iRow]);
      lp.row_lower_[iRow] = mid;
      lp.row_upper_[iRow] = mid;
    }
  }
  if (num_change) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Resolved %" HIGHSINT_FORMAT
                 " inconsistent bounds (maximum residual = "
                 "%9.4g) after presolve\n",
                 num_change, max_residual);
    return HighsStatus::kWarning;
  }
  return HighsStatus::kOk;
}